

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> * __thiscall
mjs::regexp::impl::exec
          (vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *__return_storage_ptr__,
          impl *this,wstring_view str)

{
  pointer *pprVar1;
  iterator __position;
  bool bVar2;
  wcmatch *__range2;
  pointer psVar3;
  sub_match<const_wchar_t_*> *m;
  pointer psVar4;
  wcmatch match;
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  local_58;
  regexp_match local_38;
  
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin = (wchar_t *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (str._M_str,str._M_str + str._M_len,&local_58,&this->r_,0);
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar2) {
    psVar3 = local_58.
             super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
    if (local_58.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar3 = local_58.
               super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (local_58.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar3) {
      psVar4 = local_58.
               super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_38.first = (psVar4->super_pair<const_wchar_t_*,_const_wchar_t_*>).first;
        local_38.second = (psVar4->super_pair<const_wchar_t_*,_const_wchar_t_*>).second;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::
          _M_realloc_insert<mjs::regexp_match>(__return_storage_ptr__,__position,&local_38);
        }
        else {
          (__position._M_current)->first = local_38.first;
          (__position._M_current)->second = local_38.second;
          pprVar1 = &(__return_storage_ptr__->
                     super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *pprVar1 = *pprVar1 + 1;
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar3);
    }
  }
  if (local_58.
      super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<regexp_match> exec(const std::wstring_view str) const {
        std::wcmatch match;
        if (!std::regex_search(str.data(), str.data()+str.length(), match, r_)) {
            return {};
        }
        std::vector<regexp_match> res;
        for (const auto& m: match) {
            res.push_back(regexp_match{m.first, m.second});
        }
        return res;
    }